

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int select_key_share(ptls_key_exchange_algorithm_t **selected,ptls_iovec_t *peer_key,
                    ptls_key_exchange_algorithm_t **candidates,uint8_t **src,uint8_t *end,
                    int expect_one)

{
  ptls_key_exchange_algorithm_t *ppVar1;
  bool bVar2;
  ptls_key_exchange_algorithm_t **pppVar3;
  int iVar4;
  uint16_t group;
  ptls_iovec_t key;
  uint16_t local_56;
  int local_54;
  ptls_key_exchange_algorithm_t **local_50;
  ptls_key_exchange_algorithm_t **local_48;
  ptls_iovec_t local_40;
  
  *selected = (ptls_key_exchange_algorithm_t *)0x0;
  if ((expect_one == 0) || (*src != end)) {
    local_48 = candidates + 1;
    local_54 = expect_one;
    local_50 = candidates;
    do {
      if (*src == end) {
        return 0;
      }
      iVar4 = decode_key_share_entry(&local_56,&local_40,src,end);
      if (iVar4 == 0) {
        ppVar1 = *local_50;
        pppVar3 = local_48;
        while (ppVar1 != (ptls_key_exchange_algorithm_t *)0x0) {
          if ((*selected == (ptls_key_exchange_algorithm_t *)0x0) && (ppVar1->id == local_56)) {
            *selected = ppVar1;
            peer_key->base = local_40.base;
            peer_key->len = local_40.len;
          }
          ppVar1 = *pppVar3;
          pppVar3 = pppVar3 + 1;
        }
        if (local_54 == 0) {
          bVar2 = true;
          iVar4 = 0;
        }
        else {
          bVar2 = false;
          iVar4 = 0;
          if (*selected == (ptls_key_exchange_algorithm_t *)0x0) {
            iVar4 = 0x2f;
          }
        }
      }
      else {
        bVar2 = false;
      }
    } while (bVar2);
  }
  else {
    iVar4 = 0x2f;
  }
  return iVar4;
}

Assistant:

static int select_key_share(ptls_key_exchange_algorithm_t **selected, ptls_iovec_t *peer_key,
                            ptls_key_exchange_algorithm_t **candidates, const uint8_t **src, const uint8_t *const end,
                            int expect_one)
{
    int ret;

    *selected = NULL;

    if (expect_one && *src == end) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    while (*src != end) {
        uint16_t group;
        ptls_iovec_t key;
        if ((ret = decode_key_share_entry(&group, &key, src, end)) != 0)
            goto Exit;
        ptls_key_exchange_algorithm_t **c = candidates;
        for (; *c != NULL; ++c) {
            if (*selected == NULL && (*c)->id == group) {
                *selected = *c;
                *peer_key = key;
            }
        }
        if (expect_one) {
            ret = *selected != NULL ? 0 : PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

    ret = 0;

Exit:
    return ret;
}